

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::ReferenceRenderer::ReferenceRenderer
          (ReferenceRenderer *this,int surfaceWidth,int surfaceHeight,int numSamples,
          TextureFormat *colorFormat,TextureFormat *depthStencilFormat,Program *program)

{
  bool bVar1;
  deUint32 dVar2;
  RenderTarget *pRVar3;
  float fVar4;
  int local_590;
  MultisamplePixelBufferAccess local_560;
  MultisamplePixelBufferAccess local_538;
  PixelBufferAccess local_510;
  MultisamplePixelBufferAccess local_4e8;
  PixelBufferAccess local_4c0;
  MultisamplePixelBufferAccess local_498;
  PixelBufferAccess local_470;
  MultisamplePixelBufferAccess local_448;
  PixelBufferAccess local_420;
  MultisamplePixelBufferAccess local_3f8;
  PixelBufferAccess local_3d0;
  PixelBufferAccess local_3a8;
  PixelBufferAccess local_380;
  MultisamplePixelBufferAccess local_358;
  MultisamplePixelBufferAccess local_330;
  PixelBufferAccess local_308;
  MultisamplePixelBufferAccess local_2e0;
  PixelBufferAccess local_2b8;
  MultisamplePixelBufferAccess local_290;
  PixelBufferAccess local_268;
  MultisamplePixelBufferAccess local_240;
  PixelBufferAccess local_218;
  MultisamplePixelBufferAccess local_1f0;
  PixelBufferAccess local_1c8;
  PixelBufferAccess local_1a0;
  PixelBufferAccess local_178;
  tcu local_150 [8];
  float local_148 [2];
  TextureFormat local_140;
  undefined1 local_138 [8];
  Vec4 clearColor;
  PixelBufferAccess local_118;
  UVec4 local_f0;
  PixelBufferAccess local_e0;
  IVec4 local_b8;
  PixelBufferAccess local_a8;
  IVec4 local_80;
  PixelBufferAccess local_70;
  int local_48;
  byte local_43;
  byte local_42;
  byte local_41;
  int actualSamples;
  bool hasStencilBufferOnly;
  bool hasDepthBufferOnly;
  bool hasDepthStencil;
  TextureChannelClass formatClass;
  TextureFormat *local_30;
  TextureFormat *depthStencilFormat_local;
  TextureFormat *colorFormat_local;
  int local_18;
  int numSamples_local;
  int surfaceHeight_local;
  int surfaceWidth_local;
  ReferenceRenderer *this_local;
  
  this->_vptr_ReferenceRenderer = (_func_int **)&PTR__ReferenceRenderer_016624a8;
  local_30 = depthStencilFormat;
  depthStencilFormat_local = colorFormat;
  colorFormat_local._4_4_ = numSamples;
  local_18 = surfaceHeight;
  numSamples_local = surfaceWidth;
  _surfaceHeight_local = this;
  rr::Renderer::Renderer(&this->m_renderer);
  this->m_surfaceWidth = numSamples_local;
  this->m_surfaceHeight = local_18;
  this->m_numSamples = colorFormat_local._4_4_;
  this->m_colorFormat = *depthStencilFormat_local;
  this->m_depthStencilFormat = *local_30;
  tcu::TextureLevel::TextureLevel(&this->m_colorBuffer);
  tcu::TextureLevel::TextureLevel(&this->m_resolveColorBuffer);
  tcu::TextureLevel::TextureLevel(&this->m_depthStencilBuffer);
  this->m_program = program;
  actualSamples = tcu::getTextureChannelClass(depthStencilFormat_local->type);
  local_41 = (this->m_depthStencilFormat).order != CHANNELORDER_LAST;
  local_42 = (this->m_depthStencilFormat).order == D;
  local_43 = (this->m_depthStencilFormat).order == S;
  if ((actualSamples == TEXTURECHANNELCLASS_SIGNED_INTEGER) ||
     (actualSamples == TEXTURECHANNELCLASS_UNSIGNED_INTEGER)) {
    local_590 = 1;
  }
  else {
    local_590 = this->m_numSamples;
  }
  local_48 = local_590;
  tcu::TextureLevel::setStorage
            (&this->m_colorBuffer,&this->m_colorFormat,local_590,this->m_surfaceWidth,
             this->m_surfaceHeight);
  tcu::TextureLevel::setStorage
            (&this->m_resolveColorBuffer,&this->m_colorFormat,this->m_surfaceWidth,
             this->m_surfaceHeight,1);
  if (actualSamples == 2) {
    tcu::TextureLevel::getAccess(&local_70,&this->m_colorBuffer);
    defaultClearColorInt((pipeline *)&local_80,&this->m_colorFormat);
    tcu::clear(&local_70,&local_80);
    tcu::TextureLevel::getAccess(&local_a8,&this->m_resolveColorBuffer);
    defaultClearColorInt((pipeline *)&local_b8,&this->m_colorFormat);
    tcu::clear(&local_a8,&local_b8);
  }
  else if (actualSamples == 3) {
    tcu::TextureLevel::getAccess(&local_e0,&this->m_colorBuffer);
    defaultClearColorUint((pipeline *)&local_f0,&this->m_colorFormat);
    tcu::clear(&local_e0,&local_f0);
    tcu::TextureLevel::getAccess(&local_118,&this->m_resolveColorBuffer);
    defaultClearColorUint((pipeline *)(clearColor.m_data + 2),&this->m_colorFormat);
    tcu::clear(&local_118,(UVec4 *)(clearColor.m_data + 2));
  }
  else {
    defaultClearColor((pipeline *)local_138,&this->m_colorFormat);
    local_140 = this->m_colorFormat;
    bVar1 = tcu::isSRGB(local_140);
    if (bVar1) {
      tcu::linearToSRGB(local_150,(Vec4 *)local_138);
      local_138[0] = local_150[0];
      local_138[1] = local_150[1];
      local_138[2] = local_150[2];
      local_138[3] = local_150[3];
      local_138[4] = local_150[4];
      local_138[5] = local_150[5];
      local_138[6] = local_150[6];
      local_138[7] = local_150[7];
      clearColor.m_data[0] = local_148[0];
      clearColor.m_data[1] = local_148[1];
    }
    tcu::TextureLevel::getAccess(&local_178,&this->m_colorBuffer);
    tcu::clear(&local_178,(Vec4 *)local_138);
    tcu::TextureLevel::getAccess(&local_1a0,&this->m_resolveColorBuffer);
    tcu::clear(&local_1a0,(Vec4 *)local_138);
  }
  if ((local_41 & 1) == 0) {
    pRVar3 = (RenderTarget *)operator_new(0xf8);
    tcu::TextureLevel::getAccess(&local_510,&this->m_colorBuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_4e8,&local_510);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_538);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_560);
    rr::RenderTarget::RenderTarget(pRVar3,&local_4e8,&local_538,&local_560);
    this->m_renderTarget = pRVar3;
  }
  else if ((local_42 & 1) == 0) {
    if ((local_43 & 1) == 0) {
      tcu::TextureLevel::setStorage
                (&this->m_depthStencilBuffer,&this->m_depthStencilFormat,local_48,numSamples_local,
                 local_18);
      tcu::TextureLevel::getAccess(&local_3a8,&this->m_depthStencilBuffer);
      fVar4 = defaultClearDepth();
      tcu::clearDepth(&local_3a8,fVar4);
      tcu::TextureLevel::getAccess(&local_3d0,&this->m_depthStencilBuffer);
      dVar2 = defaultClearStencil();
      tcu::clearStencil(&local_3d0,dVar2);
      pRVar3 = (RenderTarget *)operator_new(0xf8);
      tcu::TextureLevel::getAccess(&local_420,&this->m_colorBuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_3f8,&local_420);
      tcu::TextureLevel::getAccess(&local_470,&this->m_depthStencilBuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_448,&local_470);
      tcu::TextureLevel::getAccess(&local_4c0,&this->m_depthStencilBuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_498,&local_4c0);
      rr::RenderTarget::RenderTarget(pRVar3,&local_3f8,&local_448,&local_498);
      this->m_renderTarget = pRVar3;
    }
    else {
      tcu::TextureLevel::setStorage
                (&this->m_depthStencilBuffer,&this->m_depthStencilFormat,local_48,numSamples_local,
                 local_18);
      tcu::TextureLevel::getAccess(&local_2b8,&this->m_depthStencilBuffer);
      dVar2 = defaultClearStencil();
      tcu::clearStencil(&local_2b8,dVar2);
      pRVar3 = (RenderTarget *)operator_new(0xf8);
      tcu::TextureLevel::getAccess(&local_308,&this->m_colorBuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_2e0,&local_308);
      rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_330);
      tcu::TextureLevel::getAccess(&local_380,&this->m_depthStencilBuffer);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_358,&local_380);
      rr::RenderTarget::RenderTarget(pRVar3,&local_2e0,&local_330,&local_358);
      this->m_renderTarget = pRVar3;
    }
  }
  else {
    tcu::TextureLevel::setStorage
              (&this->m_depthStencilBuffer,&this->m_depthStencilFormat,local_48,numSamples_local,
               local_18);
    tcu::TextureLevel::getAccess(&local_1c8,&this->m_depthStencilBuffer);
    fVar4 = defaultClearDepth();
    tcu::clearDepth(&local_1c8,fVar4);
    pRVar3 = (RenderTarget *)operator_new(0xf8);
    tcu::TextureLevel::getAccess(&local_218,&this->m_colorBuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_1f0,&local_218);
    tcu::TextureLevel::getAccess(&local_268,&this->m_depthStencilBuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_240,&local_268);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_290);
    rr::RenderTarget::RenderTarget(pRVar3,&local_1f0,&local_240,&local_290);
    this->m_renderTarget = pRVar3;
  }
  return;
}

Assistant:

ReferenceRenderer::ReferenceRenderer(int						surfaceWidth,
									 int						surfaceHeight,
									 int						numSamples,
									 const tcu::TextureFormat&	colorFormat,
									 const tcu::TextureFormat&	depthStencilFormat,
									 const rr::Program* const	program)
	: m_surfaceWidth		(surfaceWidth)
	, m_surfaceHeight		(surfaceHeight)
	, m_numSamples			(numSamples)
	, m_colorFormat			(colorFormat)
	, m_depthStencilFormat	(depthStencilFormat)
	, m_program				(program)
{
	const tcu::TextureChannelClass	formatClass				= tcu::getTextureChannelClass(colorFormat.type);
	const bool						hasDepthStencil			= (m_depthStencilFormat.order != tcu::TextureFormat::CHANNELORDER_LAST);
	const bool						hasDepthBufferOnly		= (m_depthStencilFormat.order == tcu::TextureFormat::D);
	const bool						hasStencilBufferOnly	= (m_depthStencilFormat.order == tcu::TextureFormat::S);
	const int						actualSamples			= (formatClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER || formatClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)? 1: m_numSamples;

	m_colorBuffer.setStorage(m_colorFormat, actualSamples, m_surfaceWidth, m_surfaceHeight);
	m_resolveColorBuffer.setStorage(m_colorFormat, m_surfaceWidth, m_surfaceHeight);

	if (formatClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
	{
		tcu::clear(m_colorBuffer.getAccess(), defaultClearColorInt(m_colorFormat));
		tcu::clear(m_resolveColorBuffer.getAccess(), defaultClearColorInt(m_colorFormat));
	}
	else if (formatClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
	{
		tcu::clear(m_colorBuffer.getAccess(), defaultClearColorUint(m_colorFormat));
		tcu::clear(m_resolveColorBuffer.getAccess(), defaultClearColorUint(m_colorFormat));
	}
	else
	{
		tcu::Vec4 clearColor = defaultClearColor(m_colorFormat);

		if (isSRGB(m_colorFormat))
			clearColor = tcu::linearToSRGB(clearColor);

		tcu::clear(m_colorBuffer.getAccess(), clearColor);
		tcu::clear(m_resolveColorBuffer.getAccess(), clearColor);
	}

	if (hasDepthStencil)
	{
		if (hasDepthBufferOnly)
		{
			m_depthStencilBuffer.setStorage(m_depthStencilFormat, actualSamples, surfaceWidth, surfaceHeight);
			tcu::clearDepth(m_depthStencilBuffer.getAccess(), defaultClearDepth());

			m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()));
		}
		else if (hasStencilBufferOnly)
		{
			m_depthStencilBuffer.setStorage(m_depthStencilFormat, actualSamples, surfaceWidth, surfaceHeight);
			tcu::clearStencil(m_depthStencilBuffer.getAccess(), defaultClearStencil());

			m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess(),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()));
		}
		else
		{
			m_depthStencilBuffer.setStorage(m_depthStencilFormat, actualSamples, surfaceWidth, surfaceHeight);

			tcu::clearDepth(m_depthStencilBuffer.getAccess(), defaultClearDepth());
			tcu::clearStencil(m_depthStencilBuffer.getAccess(), defaultClearStencil());

			m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()));
		}
	}
	else
	{
		m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()));
	}
}